

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O0

const_iterator * __thiscall
pstore::index::
hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::find<pstore::indirect_string,void>
          (const_iterator *__return_storage_ptr__,void *this,database *db,indirect_string *key)

{
  const_iterator local_118;
  indirect_string *local_28;
  indirect_string *key_local;
  database *db_local;
  hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *this_local;
  
  local_28 = key;
  key_local = (indirect_string *)db;
  db_local = (database *)this;
  this_local = (hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *)__return_storage_ptr__;
  hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
  ::find<pstore::indirect_string,void>
            (&local_118,
             (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
              *)((long)this + 8),db,key);
  hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  ::
  set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
  ::set_iterator(__return_storage_ptr__,&local_118);
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  ::iterator_base<true>::~iterator_base(&local_118);
  return __return_storage_ptr__;
}

Assistant:

const_iterator find (database const & db, OtherKeyType const & key) const {
                return const_iterator{map_.find (db, key)};
            }